

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O3

void addterm(_func_void *func,char *name)

{
  long lVar1;
  
  if (0 < (long)NumTerms) {
    lVar1 = 0;
    do {
      if (*(_func_void **)((long)TermFuncs + lVar1) == func) {
        return;
      }
      lVar1 = lVar1 + 8;
    } while ((long)NumTerms << 3 != lVar1);
    if (NumTerms == 0x40) {
      (*func)();
      I_FatalError("Too many exit functions registered.\nIncrease MAX_TERMS in i_main.cpp");
    }
  }
  TermNames[NumTerms] = name;
  lVar1 = (long)NumTerms;
  NumTerms = NumTerms + 1;
  TermFuncs[lVar1] = func;
  return;
}

Assistant:

void addterm (void (*func) (), const char *name)
{
	// Make sure this function wasn't already registered.
	for (int i = 0; i < NumTerms; ++i)
	{
		if (TermFuncs[i] == func)
		{
			return;
		}
	}
    if (NumTerms == MAX_TERMS)
	{
		func ();
		I_FatalError (
			"Too many exit functions registered.\n"
			"Increase MAX_TERMS in i_main.cpp");
	}
	TermNames[NumTerms] = name;
    TermFuncs[NumTerms++] = func;
}